

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.capnp.h
# Opt level: O0

void __thiscall capnp::rpc::Message::Builder::setUnimplemented(Builder *this,Reader value)

{
  PointerBuilder builder;
  Reader value_00;
  uint uVar1;
  undefined8 in_stack_ffffffffffffff90;
  WirePointer *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::rpc::Message::Which>
            (&this->_builder,uVar1,UNIMPLEMENTED);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  memcpy(&local_58,&value,0x30);
  builder.capTable = (CapTableBuilder *)local_28.pointer;
  builder.segment = (SegmentBuilder *)local_28.capTable;
  builder.pointer = local_58;
  value_00._reader.capTable = (CapTableReader *)local_48;
  value_00._reader.segment = (SegmentReader *)uStack_50;
  value_00._reader.data = (void *)uStack_40;
  value_00._reader.pointers = (WirePointer *)local_38;
  value_00._reader.dataSize = (undefined4)uStack_30;
  value_00._reader.pointerCount = uStack_30._4_2_;
  value_00._reader._38_2_ = uStack_30._6_2_;
  value_00._reader._40_8_ = in_stack_ffffffffffffff90;
  capnp::_::PointerHelpers<capnp::rpc::Message,_(capnp::Kind)3>::set(builder,value_00);
  return;
}

Assistant:

inline void Message::Builder::setUnimplemented( ::capnp::rpc::Message::Reader value) {
  _builder.setDataField<Message::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Message::UNIMPLEMENTED);
  ::capnp::_::PointerHelpers< ::capnp::rpc::Message>::set(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), value);
}